

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_suite.cpp
# Opt level: O0

void value_count_suite::count_string(void)

{
  size_type sVar1;
  undefined4 local_f4c;
  basic_variable<std::allocator<char>_> local_f48;
  size_type local_f18;
  undefined4 local_f0c;
  basic_variable<std::allocator<char>_> local_f08;
  size_type local_ed8;
  undefined4 local_ecc;
  basic_variable<std::allocator<char>_> local_ec8;
  size_type local_e98;
  undefined4 local_e8c;
  size_type local_e88;
  undefined4 local_e7c;
  basic_variable<std::allocator<char>_> local_e78;
  size_type local_e48;
  undefined4 local_e3c;
  size_type local_e38;
  undefined4 local_e2c;
  basic_variable<std::allocator<char>_> local_e28;
  size_type local_df8;
  undefined4 local_dec;
  size_type local_de8;
  undefined4 local_ddc;
  basic_variable<std::allocator<char>_> local_dd8;
  size_type local_da8;
  undefined4 local_d9c;
  size_type local_d98;
  undefined4 local_d8c;
  basic_variable<std::allocator<char>_> local_d88;
  size_type local_d58;
  undefined4 local_d4c;
  size_type local_d48;
  undefined4 local_d3c;
  basic_variable<std::allocator<char>_> local_d38;
  size_type local_d00;
  undefined4 local_cf4;
  double local_cf0;
  size_type local_ce8;
  undefined4 local_cdc;
  basic_variable<std::allocator<char>_> local_cd8;
  size_type local_ca0 [2];
  undefined4 local_c90;
  int local_c8c;
  size_type local_c88;
  undefined4 local_c7c;
  basic_variable<std::allocator<char>_> local_c78;
  size_type local_c40 [2];
  undefined4 local_c30;
  bool local_c29;
  size_type local_c28;
  undefined4 local_c1c;
  basic_variable<std::allocator<char>_> local_c18;
  size_type local_be0 [2];
  undefined4 local_bd0;
  nullable local_bcc;
  size_type local_bc8 [2];
  undefined1 local_bb8 [8];
  variable data_3;
  undefined4 local_b7c;
  basic_variable<std::allocator<char>_> local_b78;
  size_type local_b48;
  undefined4 local_b3c;
  basic_variable<std::allocator<char>_> local_b38;
  size_type local_b08;
  undefined4 local_afc;
  basic_variable<std::allocator<char>_> local_af8;
  size_type local_ac8;
  undefined4 local_abc;
  size_type local_ab8;
  undefined4 local_aac;
  basic_variable<std::allocator<char>_> local_aa8;
  size_type local_a78;
  undefined4 local_a6c;
  size_type local_a68;
  undefined4 local_a5c;
  basic_variable<std::allocator<char>_> local_a58;
  size_type local_a28;
  undefined4 local_a1c;
  size_type local_a18;
  undefined4 local_a0c;
  basic_variable<std::allocator<char>_> local_a08;
  size_type local_9d8;
  undefined4 local_9cc;
  size_type local_9c8;
  undefined4 local_9bc;
  basic_variable<std::allocator<char>_> local_9b8;
  size_type local_988;
  undefined4 local_97c;
  size_type local_978;
  undefined4 local_96c;
  basic_variable<std::allocator<char>_> local_968;
  size_type local_930;
  undefined4 local_924;
  double local_920;
  size_type local_918;
  undefined4 local_90c;
  basic_variable<std::allocator<char>_> local_908;
  size_type local_8d0 [2];
  undefined4 local_8c0;
  int local_8bc;
  size_type local_8b8;
  undefined4 local_8ac;
  basic_variable<std::allocator<char>_> local_8a8;
  size_type local_870 [2];
  undefined4 local_860;
  bool local_859;
  size_type local_858;
  undefined4 local_84c;
  basic_variable<std::allocator<char>_> local_848;
  size_type local_810 [2];
  undefined4 local_800;
  nullable local_7fc;
  size_type local_7f8 [2];
  undefined1 local_7e8 [8];
  variable data_2;
  undefined4 local_7ac;
  basic_variable<std::allocator<char>_> local_7a8;
  size_type local_778;
  undefined4 local_76c;
  basic_variable<std::allocator<char>_> local_768;
  size_type local_738;
  undefined4 local_72c;
  basic_variable<std::allocator<char>_> local_728;
  size_type local_6f8;
  undefined4 local_6ec;
  size_type local_6e8;
  undefined4 local_6dc;
  basic_variable<std::allocator<char>_> local_6d8;
  size_type local_6a8;
  undefined4 local_69c;
  size_type local_698;
  undefined4 local_68c;
  basic_variable<std::allocator<char>_> local_688;
  size_type local_658;
  undefined4 local_64c;
  size_type local_648;
  undefined4 local_63c;
  basic_variable<std::allocator<char>_> local_638;
  size_type local_608;
  undefined4 local_5fc;
  size_type local_5f8;
  undefined4 local_5ec;
  basic_variable<std::allocator<char>_> local_5e8;
  size_type local_5b8;
  undefined4 local_5ac;
  size_type local_5a8;
  undefined4 local_59c;
  basic_variable<std::allocator<char>_> local_598;
  size_type local_560;
  undefined4 local_554;
  double local_550;
  size_type local_548;
  undefined4 local_53c;
  basic_variable<std::allocator<char>_> local_538;
  size_type local_500 [2];
  undefined4 local_4f0;
  int local_4ec;
  size_type local_4e8;
  undefined4 local_4dc;
  basic_variable<std::allocator<char>_> local_4d8;
  size_type local_4a0 [2];
  undefined4 local_490;
  bool local_489;
  size_type local_488;
  undefined4 local_47c;
  basic_variable<std::allocator<char>_> local_478;
  size_type local_440 [2];
  undefined4 local_430;
  nullable local_42c;
  size_type local_428 [2];
  undefined1 local_418 [8];
  variable data_1;
  undefined4 local_3dc;
  basic_variable<std::allocator<char>_> local_3d8;
  size_type local_3a8;
  undefined4 local_39c;
  basic_variable<std::allocator<char>_> local_398;
  size_type local_368;
  undefined4 local_35c;
  basic_variable<std::allocator<char>_> local_358;
  size_type local_328;
  undefined4 local_31c;
  size_type local_318;
  undefined4 local_30c;
  basic_variable<std::allocator<char>_> local_308;
  size_type local_2d8;
  undefined4 local_2cc;
  size_type local_2c8;
  undefined4 local_2bc;
  basic_variable<std::allocator<char>_> local_2b8;
  size_type local_288;
  undefined4 local_27c;
  size_type local_278;
  undefined4 local_26c;
  basic_variable<std::allocator<char>_> local_268;
  size_type local_238;
  undefined4 local_22c;
  size_type local_228;
  undefined4 local_21c;
  basic_variable<std::allocator<char>_> local_218;
  size_type local_1e8;
  undefined4 local_1dc;
  size_type local_1d8;
  undefined4 local_1cc;
  basic_variable<std::allocator<char>_> local_1c8;
  size_type local_190;
  undefined4 local_184;
  double local_180;
  size_type local_178;
  undefined4 local_16c;
  basic_variable<std::allocator<char>_> local_168;
  size_type local_130 [2];
  undefined4 local_120;
  int local_11c;
  size_type local_118;
  undefined4 local_10c;
  basic_variable<std::allocator<char>_> local_108;
  size_type local_d0 [2];
  undefined4 local_c0;
  bool local_b9;
  size_type local_b8;
  undefined4 local_ac;
  basic_variable<std::allocator<char>_> local_a8;
  size_type local_70 [2];
  undefined4 local_60 [5];
  nullable local_4c;
  size_type local_48 [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,"alpha");
  local_4c = null;
  local_48[0] = trial::dynamic::value::count<std::allocator<char>,trial::dynamic::nullable>
                          ((basic_variable<std::allocator<char>_> *)local_38,&local_4c);
  local_60[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, null)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xb9,"void value_count_suite::count_string()",local_48,local_60);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8);
  local_70[0] = trial::dynamic::value::
                count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                          ((basic_variable<std::allocator<char>_> *)local_38,&local_a8);
  local_ac = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xba,"void value_count_suite::count_string()",local_70,&local_ac);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a8);
  local_b9 = true;
  local_b8 = trial::dynamic::value::count<std::allocator<char>,bool>
                       ((basic_variable<std::allocator<char>_> *)local_38,&local_b9);
  local_c0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, true)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xbb,"void value_count_suite::count_string()",&local_b8,&local_c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_108,true);
  local_d0[0] = trial::dynamic::value::
                count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                          ((basic_variable<std::allocator<char>_> *)local_38,&local_108);
  local_10c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(true))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xbc,"void value_count_suite::count_string()",local_d0,&local_10c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_108);
  local_11c = 2;
  local_118 = trial::dynamic::value::count<std::allocator<char>,int>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_11c);
  local_120 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 2)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xbd,"void value_count_suite::count_string()",&local_118,&local_120);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_168,2);
  local_130[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)local_38,&local_168);
  local_16c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(2))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xbe,"void value_count_suite::count_string()",local_130,&local_16c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_168);
  local_180 = 3.0;
  local_178 = trial::dynamic::value::count<std::allocator<char>,double>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_180);
  local_184 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 3.0)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xbf,"void value_count_suite::count_string()",&local_178,&local_184);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_1c8,3.0);
  local_190 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_1c8);
  local_1cc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(3.0))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xc0,"void value_count_suite::count_string()",&local_190,&local_1cc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  local_1d8 = trial::dynamic::value::count<std::allocator<char>,char[6]>
                        ((basic_variable<std::allocator<char>_> *)local_38,(char (*) [6])"alpha");
  local_1dc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, \"alpha\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xc1,"void value_count_suite::count_string()",&local_1d8,&local_1dc);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_218,"alpha");
  local_1e8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_218);
  local_21c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(\"alpha\"))","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xc2,"void value_count_suite::count_string()",&local_1e8,&local_21c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  local_228 = trial::dynamic::value::count<std::allocator<char>,char[6]>
                        ((basic_variable<std::allocator<char>_> *)local_38,(char (*) [6])"bravo");
  local_22c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, \"bravo\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xc3,"void value_count_suite::count_string()",&local_228,&local_22c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_268,"bravo");
  local_238 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_268);
  local_26c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(\"bravo\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xc4,"void value_count_suite::count_string()",&local_238,&local_26c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_268);
  local_278 = trial::dynamic::value::count<std::allocator<char>,wchar_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_38,(wchar_t (*) [6])L"alpha"
                        );
  local_27c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, L\"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xc5,"void value_count_suite::count_string()",&local_278,&local_27c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2b8,L"alpha");
  local_288 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_2b8);
  local_2bc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(L\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xc6,"void value_count_suite::count_string()",&local_288,&local_2bc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2b8);
  local_2c8 = trial::dynamic::value::count<std::allocator<char>,char16_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_38,
                         (char16_t (*) [6])L"alpha");
  local_2cc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, u\"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,199,"void value_count_suite::count_string()",&local_2c8,&local_2cc);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_308,L"alpha");
  local_2d8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_308);
  local_30c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(u\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,200,"void value_count_suite::count_string()",&local_2d8,&local_30c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_308);
  local_318 = trial::dynamic::value::count<std::allocator<char>,char32_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_38,
                         (char32_t (*) [6])L"alpha");
  local_31c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, U\"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xc9,"void value_count_suite::count_string()",&local_318,&local_31c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_358,L"alpha");
  local_328 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_358);
  local_35c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(U\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xca,"void value_count_suite::count_string()",&local_328,&local_35c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_368 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_398);
  local_39c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, array::make())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xcb,"void value_count_suite::count_string()",&local_368,&local_39c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_398);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_3a8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_3d8);
  local_3dc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, map::make())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xcc,"void value_count_suite::count_string()",&local_3a8,&local_3dc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_418,L"alpha");
  local_42c = null;
  local_428[0] = trial::dynamic::value::count<std::allocator<char>,trial::dynamic::nullable>
                           ((basic_variable<std::allocator<char>_> *)local_418,&local_42c);
  local_430 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, null)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xd1,"void value_count_suite::count_string()",local_428,&local_430);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_478);
  local_440[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)local_418,&local_478);
  local_47c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xd2,"void value_count_suite::count_string()",local_440,&local_47c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_478);
  local_489 = true;
  local_488 = trial::dynamic::value::count<std::allocator<char>,bool>
                        ((basic_variable<std::allocator<char>_> *)local_418,&local_489);
  local_490 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, true)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xd3,"void value_count_suite::count_string()",&local_488,&local_490);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_4d8,true);
  local_4a0[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)local_418,&local_4d8);
  local_4dc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(true))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xd4,"void value_count_suite::count_string()",local_4a0,&local_4dc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4d8);
  local_4ec = 2;
  local_4e8 = trial::dynamic::value::count<std::allocator<char>,int>
                        ((basic_variable<std::allocator<char>_> *)local_418,&local_4ec);
  local_4f0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 2)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xd5,"void value_count_suite::count_string()",&local_4e8,&local_4f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_538,2);
  local_500[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)local_418,&local_538);
  local_53c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(2))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xd6,"void value_count_suite::count_string()",local_500,&local_53c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_538);
  local_550 = 3.0;
  local_548 = trial::dynamic::value::count<std::allocator<char>,double>
                        ((basic_variable<std::allocator<char>_> *)local_418,&local_550);
  local_554 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 3.0)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xd7,"void value_count_suite::count_string()",&local_548,&local_554);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_598,3.0);
  local_560 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_418,&local_598);
  local_59c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(3.0))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xd8,"void value_count_suite::count_string()",&local_560,&local_59c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_598);
  local_5a8 = trial::dynamic::value::count<std::allocator<char>,char[6]>
                        ((basic_variable<std::allocator<char>_> *)local_418,(char (*) [6])"alpha");
  local_5ac = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, \"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xd9,"void value_count_suite::count_string()",&local_5a8,&local_5ac);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_5e8,"alpha");
  local_5b8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_418,&local_5e8);
  local_5ec = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xda,"void value_count_suite::count_string()",&local_5b8,&local_5ec);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5e8);
  local_5f8 = trial::dynamic::value::count<std::allocator<char>,wchar_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_418,
                         (wchar_t (*) [6])L"alpha");
  local_5fc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, L\"alpha\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xdb,"void value_count_suite::count_string()",&local_5f8,&local_5fc);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_638,L"alpha");
  local_608 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_418,&local_638);
  local_63c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(L\"alpha\"))","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xdc,"void value_count_suite::count_string()",&local_608,&local_63c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_638);
  local_648 = trial::dynamic::value::count<std::allocator<char>,wchar_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_418,
                         (wchar_t (*) [6])L"bravo");
  local_64c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, L\"bravo\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xdd,"void value_count_suite::count_string()",&local_648,&local_64c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_688,L"bravo");
  local_658 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_418,&local_688);
  local_68c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(L\"bravo\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xde,"void value_count_suite::count_string()",&local_658,&local_68c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_688);
  local_698 = trial::dynamic::value::count<std::allocator<char>,char16_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_418,
                         (char16_t (*) [6])L"alpha");
  local_69c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, u\"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xdf,"void value_count_suite::count_string()",&local_698,&local_69c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6d8,L"alpha");
  local_6a8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_418,&local_6d8);
  local_6dc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(u\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xe0,"void value_count_suite::count_string()",&local_6a8,&local_6dc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6d8);
  local_6e8 = trial::dynamic::value::count<std::allocator<char>,char32_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_418,
                         (char32_t (*) [6])L"alpha");
  local_6ec = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, U\"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xe1,"void value_count_suite::count_string()",&local_6e8,&local_6ec);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_728,L"alpha");
  local_6f8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_418,&local_728);
  local_72c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(U\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xe2,"void value_count_suite::count_string()",&local_6f8,&local_72c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_728);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_738 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_418,&local_768);
  local_76c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, array::make())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xe3,"void value_count_suite::count_string()",&local_738,&local_76c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_768);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_778 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_418,&local_7a8);
  local_7ac = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, map::make())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xe4,"void value_count_suite::count_string()",&local_778,&local_7ac);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_7e8,L"alpha");
  local_7fc = null;
  local_7f8[0] = trial::dynamic::value::count<std::allocator<char>,trial::dynamic::nullable>
                           ((basic_variable<std::allocator<char>_> *)local_7e8,&local_7fc);
  local_800 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, null)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xe9,"void value_count_suite::count_string()",local_7f8,&local_800);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_848);
  local_810[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)local_7e8,&local_848);
  local_84c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xea,"void value_count_suite::count_string()",local_810,&local_84c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_848);
  local_859 = true;
  local_858 = trial::dynamic::value::count<std::allocator<char>,bool>
                        ((basic_variable<std::allocator<char>_> *)local_7e8,&local_859);
  local_860 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, true)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xeb,"void value_count_suite::count_string()",&local_858,&local_860);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_8a8,true);
  local_870[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)local_7e8,&local_8a8);
  local_8ac = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(true))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xec,"void value_count_suite::count_string()",local_870,&local_8ac);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8a8);
  local_8bc = 2;
  local_8b8 = trial::dynamic::value::count<std::allocator<char>,int>
                        ((basic_variable<std::allocator<char>_> *)local_7e8,&local_8bc);
  local_8c0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 2)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xed,"void value_count_suite::count_string()",&local_8b8,&local_8c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_908,2);
  local_8d0[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)local_7e8,&local_908);
  local_90c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(2))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xee,"void value_count_suite::count_string()",local_8d0,&local_90c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_908);
  local_920 = 3.0;
  local_918 = trial::dynamic::value::count<std::allocator<char>,double>
                        ((basic_variable<std::allocator<char>_> *)local_7e8,&local_920);
  local_924 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 3.0)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xef,"void value_count_suite::count_string()",&local_918,&local_924);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_968,3.0);
  local_930 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_7e8,&local_968);
  local_96c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(3.0))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xf0,"void value_count_suite::count_string()",&local_930,&local_96c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_968);
  local_978 = trial::dynamic::value::count<std::allocator<char>,char[6]>
                        ((basic_variable<std::allocator<char>_> *)local_7e8,(char (*) [6])"alpha");
  local_97c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, \"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xf1,"void value_count_suite::count_string()",&local_978,&local_97c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_9b8,"alpha");
  local_988 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_7e8,&local_9b8);
  local_9bc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xf2,"void value_count_suite::count_string()",&local_988,&local_9bc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9b8);
  local_9c8 = trial::dynamic::value::count<std::allocator<char>,wchar_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_7e8,
                         (wchar_t (*) [6])L"alpha");
  local_9cc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, L\"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xf3,"void value_count_suite::count_string()",&local_9c8,&local_9cc);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a08,L"alpha");
  local_9d8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_7e8,&local_a08);
  local_a0c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(L\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xf4,"void value_count_suite::count_string()",&local_9d8,&local_a0c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a08);
  local_a18 = trial::dynamic::value::count<std::allocator<char>,char16_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_7e8,
                         (char16_t (*) [6])L"alpha");
  local_a1c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, u\"alpha\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xf5,"void value_count_suite::count_string()",&local_a18,&local_a1c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a58,L"alpha");
  local_a28 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_7e8,&local_a58);
  local_a5c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(u\"alpha\"))","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xf6,"void value_count_suite::count_string()",&local_a28,&local_a5c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a58);
  local_a68 = trial::dynamic::value::count<std::allocator<char>,char16_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_7e8,
                         (char16_t (*) [6])L"bravo");
  local_a6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, u\"bravo\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xf7,"void value_count_suite::count_string()",&local_a68,&local_a6c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_aa8,L"bravo");
  local_a78 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_7e8,&local_aa8);
  local_aac = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(u\"bravo\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xf8,"void value_count_suite::count_string()",&local_a78,&local_aac);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_aa8);
  local_ab8 = trial::dynamic::value::count<std::allocator<char>,char32_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_7e8,
                         (char32_t (*) [6])L"alpha");
  local_abc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, U\"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xf9,"void value_count_suite::count_string()",&local_ab8,&local_abc);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_af8,L"alpha");
  local_ac8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_7e8,&local_af8);
  local_afc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(U\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xfa,"void value_count_suite::count_string()",&local_ac8,&local_afc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_af8);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_b08 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_7e8,&local_b38);
  local_b3c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, array::make())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xfb,"void value_count_suite::count_string()",&local_b08,&local_b3c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b38);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_b48 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_7e8,&local_b78);
  local_b7c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, map::make())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0xfc,"void value_count_suite::count_string()",&local_b48,&local_b7c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_7e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_bb8,L"alpha");
  local_bcc = null;
  local_bc8[0] = trial::dynamic::value::count<std::allocator<char>,trial::dynamic::nullable>
                           ((basic_variable<std::allocator<char>_> *)local_bb8,&local_bcc);
  local_bd0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, null)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x101,"void value_count_suite::count_string()",local_bc8,&local_bd0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_c18);
  local_be0[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)local_bb8,&local_c18);
  local_c1c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x102,"void value_count_suite::count_string()",local_be0,&local_c1c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c18);
  local_c29 = true;
  local_c28 = trial::dynamic::value::count<std::allocator<char>,bool>
                        ((basic_variable<std::allocator<char>_> *)local_bb8,&local_c29);
  local_c30 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, true)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x103,"void value_count_suite::count_string()",&local_c28,&local_c30);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_c78,true);
  local_c40[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)local_bb8,&local_c78);
  local_c7c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(true))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x104,"void value_count_suite::count_string()",local_c40,&local_c7c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c78);
  local_c8c = 2;
  local_c88 = trial::dynamic::value::count<std::allocator<char>,int>
                        ((basic_variable<std::allocator<char>_> *)local_bb8,&local_c8c);
  local_c90 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 2)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x105,"void value_count_suite::count_string()",&local_c88,&local_c90);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_cd8,2);
  local_ca0[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)local_bb8,&local_cd8);
  local_cdc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(2))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x106,"void value_count_suite::count_string()",local_ca0,&local_cdc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_cd8);
  local_cf0 = 3.0;
  local_ce8 = trial::dynamic::value::count<std::allocator<char>,double>
                        ((basic_variable<std::allocator<char>_> *)local_bb8,&local_cf0);
  local_cf4 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 3.0)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x107,"void value_count_suite::count_string()",&local_ce8,&local_cf4);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_d38,3.0);
  local_d00 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_bb8,&local_d38);
  local_d3c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(3.0))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x108,"void value_count_suite::count_string()",&local_d00,&local_d3c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d38);
  local_d48 = trial::dynamic::value::count<std::allocator<char>,char[6]>
                        ((basic_variable<std::allocator<char>_> *)local_bb8,(char (*) [6])"alpha");
  local_d4c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, \"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x109,"void value_count_suite::count_string()",&local_d48,&local_d4c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d88,"alpha");
  local_d58 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_bb8,&local_d88);
  local_d8c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x10a,"void value_count_suite::count_string()",&local_d58,&local_d8c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d88);
  local_d98 = trial::dynamic::value::count<std::allocator<char>,wchar_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_bb8,
                         (wchar_t (*) [6])L"alpha");
  local_d9c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, L\"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x10b,"void value_count_suite::count_string()",&local_d98,&local_d9c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_dd8,L"alpha");
  local_da8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_bb8,&local_dd8);
  local_ddc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(L\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x10c,"void value_count_suite::count_string()",&local_da8,&local_ddc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_dd8);
  local_de8 = trial::dynamic::value::count<std::allocator<char>,char16_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_bb8,
                         (char16_t (*) [6])L"alpha");
  local_dec = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, u\"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x10d,"void value_count_suite::count_string()",&local_de8,&local_dec);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_e28,L"alpha");
  local_df8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_bb8,&local_e28);
  local_e2c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(u\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x10e,"void value_count_suite::count_string()",&local_df8,&local_e2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e28);
  local_e38 = trial::dynamic::value::count<std::allocator<char>,char16_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_bb8,
                         (char16_t (*) [6])L"bravo");
  local_e3c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, u\"bravo\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x10f,"void value_count_suite::count_string()",&local_e38,&local_e3c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_e78,L"bravo");
  local_e48 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_bb8,&local_e78);
  local_e7c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(u\"bravo\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x110,"void value_count_suite::count_string()",&local_e48,&local_e7c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e78);
  local_e88 = trial::dynamic::value::count<std::allocator<char>,char32_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_bb8,
                         (char32_t (*) [6])L"alpha");
  local_e8c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, U\"alpha\")","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x111,"void value_count_suite::count_string()",&local_e88,&local_e8c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_ec8,L"alpha");
  local_e98 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_bb8,&local_ec8);
  local_ecc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(U\"alpha\"))","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x112,"void value_count_suite::count_string()",&local_e98,&local_ecc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_ec8);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  sVar1 = trial::dynamic::value::
          count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>_> *)local_bb8,&local_f08);
  local_f0c = 0;
  local_ed8 = sVar1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, array::make())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x113,"void value_count_suite::count_string()",&local_ed8,&local_f0c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_f08);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_f18 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_bb8,&local_f48);
  local_f4c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, map::make())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x114,"void value_count_suite::count_string()",&local_f18,&local_f4c,local_f18,sVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_f48);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_bb8);
  return;
}

Assistant:

void count_string()
{
    {
        variable data("alpha");

        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, null), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable()), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, true), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(true)), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 2), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(2)), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 3.0), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(3.0)), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, "alpha"), 1);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable("alpha")), 1);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, "bravo"), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable("bravo")), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, L"alpha"), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(L"alpha")), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, u"alpha"), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(u"alpha")), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, U"alpha"), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(U"alpha")), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, array::make()), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, map::make()), 0);
    }
    {
        variable data(L"alpha");

        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, null), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable()), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, true), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(true)), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 2), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(2)), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 3.0), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(3.0)), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, "alpha"), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable("alpha")), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, L"alpha"), 1);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(L"alpha")), 1);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, L"bravo"), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(L"bravo")), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, u"alpha"), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(u"alpha")), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, U"alpha"), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(U"alpha")), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, array::make()), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, map::make()), 0);
    }
    {
        variable data(u"alpha");

        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, null), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable()), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, true), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(true)), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 2), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(2)), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 3.0), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(3.0)), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, "alpha"), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable("alpha")), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, L"alpha"), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(L"alpha")), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, u"alpha"), 1);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(u"alpha")), 1);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, u"bravo"), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(u"bravo")), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, U"alpha"), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(U"alpha")), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, array::make()), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, map::make()), 0);
    }
    {
        variable data(U"alpha");

        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, null), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable()), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, true), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(true)), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 2), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(2)), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 3.0), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(3.0)), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, "alpha"), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable("alpha")), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, L"alpha"), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(L"alpha")), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, u"alpha"), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(u"alpha")), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, u"bravo"), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(u"bravo")), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, U"alpha"), 1);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(U"alpha")), 1);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, array::make()), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, map::make()), 0);
    }
}